

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:492:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:492:17)>
             *this)

{
  int (*paiVar1) [2];
  uint uVar2;
  ssize_t sVar3;
  int iVar4;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  usleep(10000);
  paiVar1 = (this->f).pipefds;
  do {
    sVar3 = ::write((*paiVar1)[1],"foo",3);
    if (-1 < sVar3) {
      iVar4 = 0;
      break;
    }
    uVar2 = kj::_::Debug::getOsErrorNumber(false);
    this = (Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:492:17)>
            *)((ulong)this & 0xffffffff);
    if (uVar2 != 0xffffffff) {
      this = (Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:492:17)>
              *)(ulong)uVar2;
    }
    iVar4 = (int)this;
  } while (uVar2 == 0xffffffff);
  if (iVar4 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_30);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }